

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O1

void anon_unknown.dwarf_608d4::not_equals1_msg(void)

{
  string msg;
  string expected;
  string local_b8;
  Assert local_98 [2];
  int local_78 [18];
  
  local_98[0].m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_98[0].m_line = 0x84;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Extra message","");
  local_78[1] = 1;
  local_78[0] = 1;
  UnitTests::Assert::NotEquals<int,int>(local_98,&local_b8,local_78 + 1,local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_b8._M_string_length._0_4_ = 0x85;
  UnitTests::Assert::Fail((Assert *)&local_b8);
}

Assistant:

TEST(assert_true1)
    {
        try
        {
            ASSERT_TRUE(1 == 2);
            FAIL("ASSERT_TRUE should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg      = e.what();
            std::string expected = "error A1000: Assertion failure :  Expression evaluated to false";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_TRUE", __FILE__, __LINE__);
            }
        }
    }